

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

void __thiscall ECC_Context::ECC_Context(ECC_Context *this)

{
  int iVar1;
  secp256k1_context *ctx;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vseed;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (secp256k1_context_sign != (secp256k1_context *)0x0) {
    __assert_fail("secp256k1_context_sign == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x1c2,"void ECC_Start()");
  }
  ctx = secp256k1_context_create(1);
  if (ctx == (secp256k1_context *)0x0) {
    __assert_fail("ctx != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x1c5,"void ECC_Start()");
  }
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start =
       secure_allocator<unsigned_char>::allocate((secure_allocator<unsigned_char> *)&local_38,0x20);
  local_38._M_impl.super__Vector_impl_data._M_finish =
       local_38._M_impl.super__Vector_impl_data._M_start + 0x20;
  local_38._M_impl.super__Vector_impl_data._M_start[0] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[1] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[2] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[3] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[4] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[5] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[6] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[7] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[8] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[9] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[10] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0xb] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0xc] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0xd] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0xe] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0xf] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x10] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x11] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x12] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x13] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x14] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x15] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x16] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x17] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x18] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x19] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x1a] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x1b] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x1c] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x1d] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x1e] = '\0';
  local_38._M_impl.super__Vector_impl_data._M_start[0x1f] = '\0';
  bytes.m_size = 0x20;
  bytes.m_data = local_38._M_impl.super__Vector_impl_data._M_start;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38._M_impl.super__Vector_impl_data._M_finish;
  GetRandBytes(bytes);
  iVar1 = secp256k1_context_randomize(ctx,local_38._M_impl.super__Vector_impl_data._M_start);
  if (iVar1 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x1cc,"void ECC_Start()");
  }
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_38);
  secp256k1_context_sign = ctx;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ECC_Context::ECC_Context()
{
    ECC_Start();
}